

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall HighsSparseMatrix::createRowwise(HighsSparseMatrix *this,HighsSparseMatrix *matrix)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  size_type __new_size;
  vector<int,_std::allocator<int>_> ar_end;
  vector<int,_std::allocator<int>_> local_58;
  value_type_conflict2 local_34;
  
  uVar1 = matrix->num_col_;
  uVar2 = matrix->num_row_;
  uVar10 = uVar2;
  if (matrix->format_ == kColwise) {
    uVar10 = uVar1;
  }
  __new_size = (size_type)
               (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar10];
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)(int)uVar2 + 1);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_58,(long)(int)uVar2,&local_34);
  if (0 < (int)uVar1) {
    piVar5 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      lVar12 = (long)piVar5[uVar11];
      uVar13 = uVar11 + 1;
      if (piVar5[uVar11] < piVar5[uVar11 + 1]) {
        do {
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[piVar6[lVar12]] =
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[piVar6[lVar12]] + 1;
          lVar12 = lVar12 + 1;
        } while (lVar12 < piVar5[uVar13]);
      }
      uVar11 = uVar13;
    } while (uVar13 != uVar1);
  }
  piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar5 = 0;
  if (0 < (int)uVar2) {
    uVar11 = 0;
    do {
      piVar5[uVar11 + 1] =
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar11] + piVar5[uVar11];
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = piVar5[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar2 != uVar11);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,__new_size);
  if (0 < (int)uVar1) {
    piVar5 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      lVar12 = (long)piVar5[uVar11];
      uVar13 = uVar11 + 1;
      if (piVar5[uVar11] < piVar5[uVar11 + 1]) {
        do {
          iVar3 = piVar6[lVar12];
          iVar4 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar3];
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar3] = iVar4 + 1;
          piVar7[iVar4] = (int)uVar11;
          pdVar9[iVar4] = pdVar8[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 < piVar5[uVar13]);
      }
      uVar11 = uVar13;
    } while (uVar13 != uVar1);
  }
  this->format_ = kRowwise;
  this->num_col_ = uVar1;
  this->num_row_ = uVar2;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsSparseMatrix::createRowwise(const HighsSparseMatrix& matrix) {
  assert(matrix.formatOk());
  assert(matrix.isColwise());
  assert(this->formatOk());

  HighsInt num_col = matrix.num_col_;
  HighsInt num_row = matrix.num_row_;
  HighsInt num_nz = matrix.numNz();
  const vector<HighsInt>& a_start = matrix.start_;
  const vector<HighsInt>& a_index = matrix.index_;
  const vector<double>& a_value = matrix.value_;
  vector<HighsInt>& ar_start = this->start_;
  vector<HighsInt>& ar_index = this->index_;
  vector<double>& ar_value = this->value_;

  // Use ar_end to compute lengths, which are then transformed into
  // the ends of the inserted entries
  std::vector<HighsInt> ar_end;
  ar_start.resize(num_row + 1);
  ar_end.assign(num_row, 0);
  // Count the nonzeros in each row
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
      HighsInt iRow = a_index[iEl];
      ar_end[iRow]++;
    }
  }
  // Compute the starts and turn the lengths into ends
  ar_start[0] = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    ar_start[iRow + 1] = ar_start[iRow] + ar_end[iRow];
    ar_end[iRow] = ar_start[iRow];
  }
  ar_index.resize(num_nz);
  ar_value.resize(num_nz);
  // Insert the entries
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
      HighsInt iRow = a_index[iEl];
      HighsInt iToEl = ar_end[iRow]++;
      ar_index[iToEl] = iCol;
      ar_value[iToEl] = a_value[iEl];
    }
  }
  this->format_ = MatrixFormat::kRowwise;
  this->num_col_ = num_col;
  this->num_row_ = num_row;
}